

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToString.hpp
# Opt level: O0

ParseToString<std::shared_ptr<int>> * __thiscall
ut11::utility::ParseToString<std::shared_ptr<int>>::operator()[abi_cxx11_
          (ParseToString<std::shared_ptr<int>> *this,shared_ptr<int> *value)

{
  bool bVar1;
  __shared_ptr *in_RDX;
  allocator local_7b;
  byte local_7a;
  undefined4 local_79;
  byte local_55;
  byte local_42;
  allocator local_41;
  string local_40 [32];
  __shared_ptr *local_20;
  shared_ptr<int> *value_local;
  ParseToString<std::shared_ptr<int>_> *this_local;
  
  local_20 = in_RDX;
  value_local = value;
  this_local = (ParseToString<std::shared_ptr<int>_> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX);
  local_42 = 0;
  local_55 = 0;
  local_7a = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string(local_40,"shared_ptr:",&local_41);
    local_55 = 1;
    std::__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
              ((__shared_ptr_access<int,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_20);
    ParseToString<int>::operator()[abi_cxx11_((ParseToString<int> *)((long)&local_79 + 1),&local_79)
    ;
    local_7a = 1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"nullptr",&local_7b);
    std::allocator<char>::~allocator((allocator<char> *)&local_7b);
  }
  if ((local_7a & 1) != 0) {
    std::__cxx11::string::~string((string *)((long)&local_79 + 1));
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return this;
}

Assistant:

inline std::string operator()(const std::shared_ptr<T>& value) const
			{
				return value ? std::string("shared_ptr:") + ParseToString<T>()(*value) : "nullptr";
			}